

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical.cxx
# Opt level: O0

void __thiscall Unit::dimensionless(Unit *this)

{
  bool bVar1;
  ostream *poVar2;
  int local_18;
  int i;
  bool warning;
  Unit *this_local;
  
  setNames(this);
  bVar1 = false;
  for (local_18 = 0; local_18 < 7; local_18 = local_18 + 1) {
    if (this->siUnits[local_18] != 0) {
      bVar1 = true;
    }
    this->siUnits[local_18] = 0;
  }
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"warning: using(");
    poVar2 = std::operator<<(poVar2,(string *)&this->sUnitName);
    poVar2 = std::operator<<(poVar2,") as argument to a dimensionless function.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  setNames(this);
  return;
}

Assistant:

void Unit::dimensionless()
{
	setNames();
	bool warning = false;
	for(int i=0; i<7; i++) {
		if (siUnits[i])
			warning = true;
		siUnits[i] = 0;
	}
	if (warning)
		cout << "warning: using(" << sUnitName << ") as argument to a dimensionless function." << endl;
	setNames();
}